

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_abi_cxx11_
          (CompilerGLSL *this,uint32_t base,uint32_t *indices,uint32_t count,AccessChainFlags flags,
          AccessChainMeta *meta)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  ExecutionModel EVar4;
  uint uVar5;
  Types TVar6;
  CompilerError *pCVar7;
  long lVar8;
  size_t sVar9;
  mapped_type *pmVar10;
  uint *puVar11;
  string *psVar12;
  ulong uVar13;
  TypedID *this_00;
  SPIRType *pSVar14;
  char *pcVar15;
  Variant *this_01;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  CompilerGLSL *this_02;
  uint32_t *in_stack_00000008;
  uint32_t local_784;
  uint local_760;
  uint32_t local_75c;
  byte local_619;
  allocator local_5f1;
  string local_5f0 [38];
  undefined1 local_5ca;
  allocator local_5c9;
  string local_5c8 [32];
  undefined1 local_5a8 [40];
  undefined1 local_580 [71];
  byte local_539;
  SPIRConstant *pSStack_538;
  bool out_of_bounds_1;
  SPIRConstant *c;
  spirv_cross local_528 [35];
  byte local_505;
  uint32_t local_504;
  bool out_of_bounds;
  SPIRVariable *pSStack_500;
  SPIRVariable *var_1;
  string local_4f0 [3];
  bool ignore_potential_sliced_writes;
  StorageClass effective_storage;
  long local_4d0;
  size_type column_index;
  string deferred_index;
  undefined1 local_4a8 [64];
  uint32_t local_468;
  uint32_t local_464;
  string local_460 [32];
  undefined1 local_440 [68];
  TypeID local_3fc;
  string local_3f8 [8];
  string qual_mbr_name;
  string local_3d8 [32];
  string local_3b8 [32];
  BuiltIn local_398;
  char local_392;
  allocator local_391;
  BuiltIn builtin_1;
  ID local_36c;
  undefined1 local_368 [32];
  undefined1 local_348 [40];
  undefined1 local_320 [4];
  uint32_t j_1;
  spirv_cross local_300 [32];
  SPIRType *local_2e0;
  SPIRType *parent_type;
  spirv_cross local_2b8 [32];
  undefined1 local_298 [64];
  undefined1 local_258 [64];
  undefined1 local_218 [67];
  char local_1d5;
  TypedID<(spirv_cross::Types)0> local_1d4;
  BuiltIn BStack_1d0;
  bool mesh_shader;
  uint32_t local_1cc;
  BuiltIn builtin;
  SPIRVariable *var;
  undefined1 local_1a0 [40];
  undefined1 local_178 [4];
  uint32_t j;
  spirv_cross local_158 [39];
  byte local_131;
  uint local_130;
  uint uStack_12c;
  bool is_literal;
  uint32_t index;
  uint32_t i;
  anon_class_56_7_464c3a36 append_index;
  ID local_e8;
  bool dimension_flatten;
  bool pending_array_enclose;
  ID local_e0;
  bool relaxed_precision;
  uint32_t local_d8;
  byte local_d3;
  byte local_d2;
  bool is_invariant;
  uint32_t physical_type;
  bool is_packed;
  bool row_major_matrix_needs_conversion;
  bool access_chain_is_arrayed;
  SPIRType *type;
  SPIRType *local_a8;
  SPIRType *type_1;
  string local_98 [36];
  uint32_t local_74;
  undefined1 local_70 [4];
  uint32_t type_id;
  byte local_4d;
  bool old_transpose;
  SPIRExpression *local_40;
  SPIRExpression *e;
  bool flatten_member_reference;
  bool register_expression_read;
  uint uStack_30;
  bool ptr_chain;
  bool chain_only;
  bool msb_is_id;
  bool index_is_literal;
  AccessChainFlags flags_local;
  uint32_t count_local;
  uint32_t *indices_local;
  CompilerGLSL *pCStack_18;
  uint32_t base_local;
  CompilerGLSL *this_local;
  string *expr;
  
  this_02 = (CompilerGLSL *)CONCAT44(in_register_00000034,base);
  _flags_local = (TypedID<(spirv_cross::Types)0> *)CONCAT44(in_register_0000000c,count);
  indices_local._4_4_ = (uint32_t)indices;
  uStack_30 = (uint)meta;
  e._7_1_ = 0;
  _chain_only = flags;
  pCStack_18 = this_02;
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  e._6_1_ = (uStack_30 & 1) != 0;
  e._5_1_ = (uStack_30 & 0x10) != 0;
  e._4_1_ = (uStack_30 & 2) != 0;
  e._3_1_ = (uStack_30 & 4) != 0;
  e._2_1_ = (uStack_30 & 8) == 0;
  e._1_1_ = (uStack_30 & 0x20) != 0;
  if (!(bool)e._4_1_) {
    local_40 = Compiler::maybe_get<spirv_cross::SPIRExpression>
                         ((Compiler *)this_02,indices_local._4_4_);
    local_619 = 0;
    if (local_40 != (SPIRExpression *)0x0) {
      local_619 = local_40->need_transpose;
    }
    local_4d = local_619 & 1;
    if (local_40 != (SPIRExpression *)0x0) {
      local_40->need_transpose = false;
    }
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_70,base,SUB41(indices_local._4_4_,0));
    ::std::__cxx11::string::operator=((string *)this,(string *)local_70);
    ::std::__cxx11::string::~string((string *)local_70);
    if (local_40 != (SPIRExpression *)0x0) {
      local_40->need_transpose = (bool)(local_4d & 1);
    }
  }
  local_74 = Compiler::expression_type_id((Compiler *)this_02,indices_local._4_4_);
  if (((this_02->backend).native_pointers & 1U) == 0) {
    if ((e._3_1_ & 1) != 0) {
      type_1._6_1_ = 1;
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_98,
                 "Backend does not support native pointers and does not support OpPtrAccessChain.",
                 (allocator *)((long)&type_1 + 7));
      CompilerError::CompilerError(pCVar7,(string *)local_98);
      type_1._6_1_ = 0;
      __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar1 = should_dereference(this_02,indices_local._4_4_);
    if (bVar1) {
      local_a8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,local_74);
      dereference_expression((CompilerGLSL *)&type,(SPIRType *)this_02,(string *)local_a8);
      ::std::__cxx11::string::operator=((string *)this,(string *)&type);
      ::std::__cxx11::string::~string((string *)&type);
    }
  }
  _physical_type = Compiler::get_pointee_type((Compiler *)this_02,local_74);
  lVar8 = ::std::__cxx11::string::find_first_of((char)this,0x5b);
  is_invariant = lVar8 != -1;
  iVar2 = (*(this_02->super_Compiler)._vptr_Compiler[0x27])(this_02,(ulong)indices_local._4_4_);
  local_d2 = (byte)iVar2 & 1;
  local_d3 = Compiler::has_extended_decoration
                       ((Compiler *)this_02,indices_local._4_4_,
                        SPIRVCrossDecorationPhysicalTypePacked);
  local_d8 = Compiler::get_extended_decoration
                       ((Compiler *)this_02,indices_local._4_4_,SPIRVCrossDecorationPhysicalTypeID);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_e0,indices_local._4_4_);
  relaxed_precision = Compiler::has_decoration((Compiler *)this_02,local_e0,DecorationInvariant);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_e8,indices_local._4_4_);
  pending_array_enclose =
       Compiler::has_decoration((Compiler *)this_02,local_e8,DecorationRelaxedPrecision);
  append_index.physical_type._7_1_ = 0;
  append_index.physical_type._6_1_ = 0;
  _index = (__node_base_ptr)&stack0xffffffffffffffd0;
  append_index.expr = (string *)((long)&indices_local + 4);
  append_index.base = &physical_type;
  append_index.type = (SPIRType **)&is_invariant;
  append_index.access_chain_is_arrayed = (bool *)&local_d8;
  uStack_12c = 0;
  append_index.flags = (AccessChainFlags *)this_02;
  append_index.this = this;
  do {
    if (_chain_only <= uStack_12c) {
      if ((append_index.physical_type._7_1_ & 1) != 0) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_5f0,
                   "Flattening of multidimensional arrays were enabled, but the access chain was terminated in the middle of a multidimensional array. This is not supported."
                   ,&local_5f1);
        CompilerError::CompilerError(pCVar7,(string *)local_5f0);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (in_stack_00000008 != (uint32_t *)0x0) {
        *(byte *)(in_stack_00000008 + 1) = local_d2 & 1;
        *(byte *)((long)in_stack_00000008 + 5) = local_d3 & 1;
        *(byte *)((long)in_stack_00000008 + 6) = relaxed_precision & 1;
        *in_stack_00000008 = local_d8;
        *(byte *)(in_stack_00000008 + 2) = pending_array_enclose & 1;
      }
      return this;
    }
    local_130 = _flags_local[uStack_12c].id;
    local_131 = e._6_1_ & 1;
    if (((local_131 != 0) && ((e._5_1_ & 1) != 0)) && ((int)local_130 < 0)) {
      local_131 = 0;
      local_130 = local_130 & 0x7fffffff;
    }
    if (((e._3_1_ & 1) == 0) || (uStack_12c != 0)) {
      bVar1 = VectorView<unsigned_int>::empty
                        (&(_physical_type->array).super_VectorView<unsigned_int>);
      if (bVar1) {
        if (*(int *)&(_physical_type->super_IVariant).field_0xc == 0xf) {
          if ((local_131 & 1) == 0) {
            local_130 = Compiler::evaluate_constant_u32((Compiler *)this_02,local_130);
          }
          uVar5 = local_130;
          sVar9 = VectorView<unsigned_int>::size
                            (&(_physical_type->member_type_index_redirection).
                              super_VectorView<unsigned_int>);
          if (uVar5 < (uint)sVar9) {
            puVar11 = VectorView<unsigned_int>::operator[]
                                (&(_physical_type->member_type_index_redirection).
                                  super_VectorView<unsigned_int>,(ulong)local_130);
            local_130 = *puVar11;
          }
          uVar13 = (ulong)local_130;
          sVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(_physical_type->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
          if (sVar9 <= uVar13) {
            local_392 = '\x01';
            pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&builtin_1,"Member index is out of bounds!",&local_391);
            CompilerError::CompilerError(pCVar7,(string *)&builtin_1);
            local_392 = '\0';
            __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          bVar1 = Compiler::is_member_builtin
                            ((Compiler *)this_02,_physical_type,local_130,&local_398);
          if ((bVar1) &&
             (uVar5 = (*(this_02->super_Compiler)._vptr_Compiler[0x2b])
                                (this_02,(ulong)indices_local._4_4_), (uVar5 & 1) != 0)) {
            if ((is_invariant & 1U) == 0) {
              (*(this_02->super_Compiler)._vptr_Compiler[0x14])
                        (local_3d8,this_02,(ulong)local_398,(ulong)_physical_type->storage);
              ::std::__cxx11::string::operator=((string *)this,local_3d8);
              ::std::__cxx11::string::~string(local_3d8);
            }
            else {
              ::std::__cxx11::string::operator+=((string *)this,".");
              (*(this_02->super_Compiler)._vptr_Compiler[0x14])
                        (local_3b8,this_02,(ulong)local_398,(ulong)_physical_type->storage);
              ::std::__cxx11::string::operator+=((string *)this,local_3b8);
              ::std::__cxx11::string::~string(local_3b8);
            }
          }
          else {
            TypedID<(spirv_cross::Types)1>::TypedID(&local_3fc,local_74);
            psVar12 = Compiler::get_member_qualified_name_abi_cxx11_
                                ((Compiler *)this_02,local_3fc,local_130);
            ::std::__cxx11::string::string(local_3f8,(string *)psVar12);
            uVar13 = ::std::__cxx11::string::empty();
            if ((uVar13 & 1) == 0) {
              ::std::__cxx11::string::operator=((string *)this,local_3f8);
            }
            else if ((e._1_1_ & 1) == 0) {
              (*(this_02->super_Compiler)._vptr_Compiler[0x2e])
                        (local_460,this_02,(ulong)indices_local._4_4_,_physical_type,
                         (ulong)local_130,(ulong)(e._3_1_ & 1));
              ::std::__cxx11::string::operator+=((string *)this,local_460);
              ::std::__cxx11::string::~string(local_460);
            }
            else {
              to_member_name_abi_cxx11_
                        ((CompilerGLSL *)local_440,(SPIRType *)this_02,(uint32_t)_physical_type);
              join<char_const(&)[2],std::__cxx11::string>
                        ((spirv_cross *)(local_440 + 0x20),(char (*) [2])0x5b8878,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_440);
              ::std::__cxx11::string::operator+=((string *)this,(string *)(local_440 + 0x20));
              ::std::__cxx11::string::~string((string *)(local_440 + 0x20));
              ::std::__cxx11::string::~string((string *)local_440);
            }
            ::std::__cxx11::string::~string(local_3f8);
          }
          local_464 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(_physical_type->super_IVariant).self);
          bVar1 = Compiler::has_member_decoration
                            ((Compiler *)this_02,(TypeID)local_464,local_130,DecorationInvariant);
          if (bVar1) {
            relaxed_precision = true;
          }
          local_468 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(_physical_type->super_IVariant).self);
          bVar1 = Compiler::has_member_decoration
                            ((Compiler *)this_02,(TypeID)local_468,local_130,
                             DecorationRelaxedPrecision);
          if (bVar1) {
            pending_array_enclose = true;
          }
          local_d3 = member_is_packed_physical_type(this_02,_physical_type,local_130);
          bVar1 = member_is_remapped_physical_type(this_02,_physical_type,local_130);
          if (bVar1) {
            uVar3 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(_physical_type->super_IVariant).self);
            local_d8 = Compiler::get_extended_member_decoration
                                 ((Compiler *)this_02,uVar3,local_130,
                                  SPIRVCrossDecorationPhysicalTypeID);
          }
          else {
            local_d8 = 0;
          }
          iVar2 = (*(this_02->super_Compiler)._vptr_Compiler[0x28])
                            (this_02,_physical_type,(ulong)local_130);
          local_d2 = (byte)iVar2 & 1;
          this_00 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              (&(_physical_type->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                               (ulong)local_130);
          uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
          _physical_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,uVar3);
        }
        else if (_physical_type->columns < 2) {
          if (_physical_type->vecsize < 2) {
            if (((this_02->backend).allow_truncated_access_chain & 1U) == 0) {
              local_5ca = 1;
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_5c8,"Cannot subdivide a scalar value!",&local_5c9);
              CompilerError::CompilerError(pCVar7,(string *)local_5c8);
              local_5ca = 0;
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
          }
          else {
            ::std::__cxx11::string::string((string *)&column_index);
            if (((local_d2 & 1) != 0) &&
               (local_4d0 = ::std::__cxx11::string::find_last_of((char)this,0x5b), local_4d0 != -1))
            {
              ::std::__cxx11::string::substr((ulong)local_4f0,(ulong)this);
              ::std::__cxx11::string::operator=((string *)&column_index,local_4f0);
              ::std::__cxx11::string::~string(local_4f0);
              ::std::__cxx11::string::resize((ulong)this);
            }
            var_1._4_4_ = StorageClassGeneric;
            var_1._3_1_ = 0;
            if ((uStack_30 & 0x40) == 0) {
              pSVar14 = Compiler::expression_type((Compiler *)this_02,indices_local._4_4_);
              if ((pSVar14->pointer & 1U) != 0) {
                var_1._4_4_ = get_expression_effective_storage_class(this_02,indices_local._4_4_);
              }
              pSStack_500 = Compiler::maybe_get_backing_variable
                                      ((Compiler *)this_02,indices_local._4_4_);
              if (((pSStack_500 != (SPIRVariable *)0x0) &&
                  (pSStack_500->storage == StorageClassOutput)) &&
                 (EVar4 = Compiler::get_execution_model((Compiler *)this_02),
                 EVar4 == ExecutionModelTessellationControl)) {
                local_504 = (pSStack_500->super_IVariant).self.id;
                bVar1 = Compiler::has_decoration((Compiler *)this_02,(ID)local_504,DecorationPatch);
                if (!bVar1) {
                  var_1._3_1_ = 1;
                }
              }
            }
            else {
              var_1._3_1_ = 1;
            }
            if (((local_d2 & 1) == 0) && ((var_1._3_1_ & 1) == 0)) {
              uVar3 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&_physical_type->parent_type);
              pSVar14 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,uVar3);
              (*(this_02->super_Compiler)._vptr_Compiler[0x2d])
                        (this_02,this,pSVar14,(ulong)var_1._4_4_,&local_d3);
            }
            if ((local_131 & 1) == 0) {
              this_01 = VectorView<spirv_cross::Variant>::operator[]
                                  (&(this_02->super_Compiler).ir.ids.
                                    super_VectorView<spirv_cross::Variant>,(ulong)local_130);
              TVar6 = Variant::get_type(this_01);
              if (((TVar6 == TypeConstant) && ((local_d3 & 1) == 0)) && ((local_d2 & 1) == 0)) {
                pSStack_538 = Compiler::get<spirv_cross::SPIRConstant>
                                        ((Compiler *)this_02,local_130);
                uVar3 = SPIRConstant::scalar(pSStack_538,0,0);
                local_539 = _physical_type->vecsize <= uVar3;
                if ((pSStack_538->specialization & 1U) == 0) {
                  ::std::__cxx11::string::operator+=((string *)this,".");
                  if ((local_539 & 1) == 0) {
                    local_784 = SPIRConstant::scalar(pSStack_538,0,0);
                  }
                  else {
                    local_784 = 0;
                  }
                  pcVar15 = index_to_swizzle(this_02,local_784);
                  ::std::__cxx11::string::operator+=((string *)this,pcVar15);
                }
                else {
                  local_5a8[0x26] = 0;
                  if ((bool)local_539) {
                    ::std::allocator<char>::allocator();
                    local_5a8[0x26] = 1;
                    ::std::__cxx11::string::string
                              ((string *)local_580,"0",(allocator *)(local_5a8 + 0x27));
                  }
                  else {
                    to_expression_abi_cxx11_((CompilerGLSL *)local_580,base,SUB41(local_130,0));
                  }
                  join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                            ((spirv_cross *)(local_580 + 0x20),(char (*) [2])0x5b2ad8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_580,(char (*) [2])0x5ab046);
                  ::std::__cxx11::string::operator+=((string *)this,(string *)(local_580 + 0x20));
                  ::std::__cxx11::string::~string((string *)(local_580 + 0x20));
                  ::std::__cxx11::string::~string((string *)local_580);
                  if ((local_5a8[0x26] & 1) != 0) {
                    ::std::allocator<char>::~allocator((allocator<char> *)(local_5a8 + 0x27));
                  }
                }
              }
              else {
                ::std::__cxx11::string::operator+=((string *)this,"[");
                to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_5a8,base,SUB41(local_130,0))
                ;
                ::std::__cxx11::string::operator+=((string *)this,(string *)local_5a8);
                ::std::__cxx11::string::~string((string *)local_5a8);
                ::std::__cxx11::string::operator+=((string *)this,"]");
              }
            }
            else {
              local_505 = _physical_type->vecsize <= local_130;
              if (((local_d3 & 1) == 0) && ((local_d2 & 1) == 0)) {
                ::std::__cxx11::string::operator+=((string *)this,".");
                if ((local_505 & 1) == 0) {
                  local_75c = local_130;
                }
                else {
                  local_75c = 0;
                }
                pcVar15 = index_to_swizzle(this_02,local_75c);
                ::std::__cxx11::string::operator+=((string *)this,pcVar15);
              }
              else {
                if ((bool)local_505) {
                  local_760 = 0;
                }
                else {
                  local_760 = local_130;
                }
                c._4_4_ = local_760;
                join<char_const(&)[2],unsigned_int,char_const(&)[2]>
                          (local_528,(char (*) [2])0x5b2ad8,(uint *)((long)&c + 4),
                           (char (*) [2])0x5ab046);
                ::std::__cxx11::string::operator+=((string *)this,(string *)local_528);
                ::std::__cxx11::string::~string((string *)local_528);
              }
            }
            if (((local_d2 & 1) != 0) && ((var_1._3_1_ & 1) == 0)) {
              uVar3 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&_physical_type->parent_type);
              pSVar14 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,uVar3);
              (*(this_02->super_Compiler)._vptr_Compiler[0x2d])
                        (this_02,this,pSVar14,(ulong)var_1._4_4_,&local_d3);
            }
            ::std::__cxx11::string::operator+=((string *)this,(string *)&column_index);
            local_d2 = 0;
            local_d3 = 0;
            local_d8 = 0;
            local_74 = TypedID::operator_cast_to_unsigned_int
                                 ((TypedID *)&_physical_type->parent_type);
            _physical_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,local_74);
            ::std::__cxx11::string::~string((string *)&column_index);
          }
        }
        else {
          ::std::__cxx11::string::operator+=((string *)this,"[");
          if ((local_131 & 1) == 0) {
            to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_4a8,base,SUB41(local_130,0));
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_4a8);
            ::std::__cxx11::string::~string((string *)local_4a8);
          }
          else {
            convert_to_string<unsigned_int,_0>((spirv_cross *)(local_4a8 + 0x20),&local_130);
            ::std::__cxx11::string::operator+=((string *)this,(string *)(local_4a8 + 0x20));
            ::std::__cxx11::string::~string((string *)(local_4a8 + 0x20));
          }
          ::std::__cxx11::string::operator+=((string *)this,"]");
          local_74 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_physical_type->parent_type)
          ;
          _physical_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,local_74);
        }
      }
      else {
        if ((((this_02->options).flatten_multidimensional_arrays & 1U) != 0) &&
           ((append_index.physical_type._7_1_ & 1) == 0)) {
          sVar9 = VectorView<unsigned_int>::size
                            (&(_physical_type->array).super_VectorView<unsigned_int>);
          append_index.physical_type._6_1_ = 1 < sVar9;
          append_index.physical_type._7_1_ = append_index.physical_type._6_1_;
          if ((bool)append_index.physical_type._6_1_) {
            ::std::__cxx11::string::operator+=((string *)this,"[");
          }
        }
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_physical_type->parent_type);
        if (uVar3 == 0) {
          __assert_fail("type->parent_type",
                        "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0x23c9,
                        "string spirv_cross::CompilerGLSL::access_chain_internal(uint32_t, const uint32_t *, uint32_t, AccessChainFlags, AccessChainMeta *)"
                       );
        }
        _builtin = (_Hash_node_base *)
                   Compiler::maybe_get<spirv_cross::SPIRVariable>
                             ((Compiler *)this_02,indices_local._4_4_);
        if ((((((this_02->backend).force_gl_in_out_block & 1U) == 0) || (uStack_12c != 0)) ||
            ((SPIRVariable *)_builtin == (SPIRVariable *)0x0)) ||
           (bVar1 = Compiler::is_builtin_variable((Compiler *)this_02,(SPIRVariable *)_builtin),
           !bVar1)) {
LAB_00359d08:
          if ((((this_02->options).flatten_multidimensional_arrays & 1U) == 0) ||
             ((append_index.physical_type._6_1_ & 1) == 0)) {
            TypedID<(spirv_cross::Types)0>::TypedID(&local_36c,indices_local._4_4_);
            uVar3 = Compiler::get_decoration((Compiler *)this_02,local_36c,DecorationBuiltIn);
            iVar2 = (*(this_02->super_Compiler)._vptr_Compiler[0x24])(this_02,(ulong)uVar3);
            if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
              access_chain_internal::anon_class_56_7_464c3a36::operator()
                        ((anon_class_56_7_464c3a36 *)&index,local_130,(bool)(local_131 & 1),false);
            }
          }
          else {
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_physical_type->parent_type);
            local_2e0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,uVar3);
            if ((local_131 & 1) == 0) {
              to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_320,base,SUB41(local_130,0));
              ::std::__cxx11::string::operator+=((string *)this,(string *)local_320);
              ::std::__cxx11::string::~string((string *)local_320);
            }
            else {
              convert_to_string<unsigned_int,_0>(local_300,&local_130);
              ::std::__cxx11::string::operator+=((string *)this,(string *)local_300);
              ::std::__cxx11::string::~string((string *)local_300);
            }
            sVar9 = VectorView<unsigned_int>::size
                              (&(local_2e0->array).super_VectorView<unsigned_int>);
            for (local_348._36_4_ = (undefined4)sVar9; local_348._36_4_ != 0;
                local_348._36_4_ = local_348._36_4_ + -1) {
              ::std::__cxx11::string::operator+=((string *)this," * ");
              to_array_size_abi_cxx11_
                        ((CompilerGLSL *)local_368,(SPIRType *)this_02,(uint32_t)local_2e0);
              enclose_expression((CompilerGLSL *)local_348,(string *)this_02);
              ::std::__cxx11::string::operator+=((string *)this,(string *)local_348);
              ::std::__cxx11::string::~string((string *)local_348);
              ::std::__cxx11::string::~string((string *)local_368);
            }
            bVar1 = VectorView<unsigned_int>::empty
                              (&(local_2e0->array).super_VectorView<unsigned_int>);
            if (bVar1) {
              append_index.physical_type._7_1_ = 0;
            }
            else {
              ::std::__cxx11::string::operator+=((string *)this," + ");
            }
            if ((append_index.physical_type._7_1_ & 1) == 0) {
              ::std::__cxx11::string::operator+=((string *)this,"]");
            }
          }
        }
        else {
          local_1cc = (_physical_type->super_IVariant).self.id;
          bVar1 = Compiler::has_decoration((Compiler *)this_02,(ID)local_1cc,DecorationBlock);
          if (bVar1) goto LAB_00359d08;
          TypedID<(spirv_cross::Types)0>::TypedID(&local_1d4,indices_local._4_4_);
          pmVar10 = ::std::
                    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                    ::operator[](&(this_02->super_Compiler).ir.meta,&local_1d4);
          BStack_1d0 = (pmVar10->decoration).builtin_type;
          EVar4 = Compiler::get_execution_model((Compiler *)this_02);
          local_1d5 = EVar4 == ExecutionModelMeshEXT;
          bVar1 = SUB41(local_130,0);
          if (BStack_1d0 < 2) {
            if ((bool)local_1d5) {
              to_expression_abi_cxx11_((CompilerGLSL *)local_218,base,bVar1);
              join<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                        ((spirv_cross *)(local_218 + 0x20),(char (*) [20])"gl_MeshVerticesEXT[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_218,(char (*) [3])0x5b4d50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
              ::std::__cxx11::string::operator=((string *)this,(string *)(local_218 + 0x20));
              ::std::__cxx11::string::~string((string *)(local_218 + 0x20));
              ::std::__cxx11::string::~string((string *)local_218);
            }
            else if (*(StorageClass *)(_builtin + 2) == StorageClassInput) {
              to_expression_abi_cxx11_((CompilerGLSL *)local_258,base,bVar1);
              join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                        ((spirv_cross *)(local_258 + 0x20),(char (*) [7])"gl_in[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_258,(char (*) [3])0x5b4d50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
              ::std::__cxx11::string::operator=((string *)this,(string *)(local_258 + 0x20));
              ::std::__cxx11::string::~string((string *)(local_258 + 0x20));
              ::std::__cxx11::string::~string((string *)local_258);
            }
            else if (*(StorageClass *)(_builtin + 2) == StorageClassOutput) {
              to_expression_abi_cxx11_((CompilerGLSL *)local_298,base,bVar1);
              join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                        ((spirv_cross *)(local_298 + 0x20),(char (*) [8])"gl_out[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_298,(char (*) [3])0x5b4d50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
              ::std::__cxx11::string::operator=((string *)this,(string *)(local_298 + 0x20));
              ::std::__cxx11::string::~string((string *)(local_298 + 0x20));
              ::std::__cxx11::string::~string((string *)local_298);
            }
            else {
              access_chain_internal::anon_class_56_7_464c3a36::operator()
                        ((anon_class_56_7_464c3a36 *)&index,local_130,(bool)(local_131 & 1),false);
            }
          }
          else if (((BStack_1d0 == BuiltInPrimitiveId) || (BStack_1d0 - BuiltInLayer < 2)) ||
                  ((BStack_1d0 == BuiltInPrimitiveShadingRateKHR ||
                   (BStack_1d0 == BuiltInCullPrimitiveEXT)))) {
            if ((bool)local_1d5) {
              to_expression_abi_cxx11_((CompilerGLSL *)&parent_type,base,bVar1);
              join<char_const(&)[22],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                        (local_2b8,(char (*) [22])"gl_MeshPrimitivesEXT[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parent_type,(char (*) [3])0x5b4d50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
              ::std::__cxx11::string::operator=((string *)this,(string *)local_2b8);
              ::std::__cxx11::string::~string((string *)local_2b8);
              ::std::__cxx11::string::~string((string *)&parent_type);
            }
            else {
              access_chain_internal::anon_class_56_7_464c3a36::operator()
                        ((anon_class_56_7_464c3a36 *)&index,local_130,(bool)(local_131 & 1),false);
            }
          }
          else {
            access_chain_internal::anon_class_56_7_464c3a36::operator()
                      ((anon_class_56_7_464c3a36 *)&index,local_130,(bool)(local_131 & 1),false);
          }
        }
        local_74 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_physical_type->parent_type);
        _physical_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,local_74);
        is_invariant = true;
      }
    }
    else {
      if (((this_02->options).flatten_multidimensional_arrays & 1U) != 0) {
        sVar9 = VectorView<unsigned_int>::size
                          (&(_physical_type->array).super_VectorView<unsigned_int>);
        append_index.physical_type._6_1_ = sVar9 != 0;
        append_index.physical_type._7_1_ = append_index.physical_type._6_1_;
        if ((bool)append_index.physical_type._6_1_) {
          ::std::__cxx11::string::operator+=((string *)this,"[");
        }
      }
      if ((((this_02->options).flatten_multidimensional_arrays & 1U) == 0) ||
         ((append_index.physical_type._6_1_ & 1) == 0)) {
        access_chain_internal::anon_class_56_7_464c3a36::operator()
                  ((anon_class_56_7_464c3a36 *)&index,local_130,(bool)(local_131 & 1),true);
      }
      else {
        if ((local_131 & 1) == 0) {
          to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_178,base,SUB41(local_130,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_178);
          ::std::__cxx11::string::~string((string *)local_178);
        }
        else {
          convert_to_string<unsigned_int,_0>(local_158,&local_130);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_158);
          ::std::__cxx11::string::~string((string *)local_158);
        }
        sVar9 = VectorView<unsigned_int>::size
                          (&(_physical_type->array).super_VectorView<unsigned_int>);
        for (local_1a0._36_4_ = (undefined4)sVar9; local_1a0._36_4_ != 0;
            local_1a0._36_4_ = local_1a0._36_4_ + -1) {
          ::std::__cxx11::string::operator+=((string *)this," * ");
          to_array_size_abi_cxx11_
                    ((CompilerGLSL *)&var,(SPIRType *)this_02,(uint32_t)_physical_type);
          enclose_expression((CompilerGLSL *)local_1a0,(string *)this_02);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_1a0);
          ::std::__cxx11::string::~string((string *)local_1a0);
          ::std::__cxx11::string::~string((string *)&var);
        }
        bVar1 = VectorView<unsigned_int>::empty
                          (&(_physical_type->array).super_VectorView<unsigned_int>);
        if (bVar1) {
          append_index.physical_type._7_1_ = 0;
        }
        else {
          ::std::__cxx11::string::operator+=((string *)this," + ");
        }
        if ((append_index.physical_type._7_1_ & 1) == 0) {
          ::std::__cxx11::string::operator+=((string *)this,"]");
        }
      }
      if (*(int *)&(_physical_type->super_IVariant).field_0xc == 0x15) {
        local_74 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_physical_type->parent_type);
        _physical_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_02,local_74);
      }
      is_invariant = true;
    }
    uStack_12c = uStack_12c + 1;
  } while( true );
}

Assistant:

string CompilerGLSL::access_chain_internal(uint32_t base, const uint32_t *indices, uint32_t count,
                                           AccessChainFlags flags, AccessChainMeta *meta)
{
	string expr;

	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool msb_is_id = (flags & ACCESS_CHAIN_LITERAL_MSB_FORCE_ID) != 0;
	bool chain_only = (flags & ACCESS_CHAIN_CHAIN_ONLY_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;
	bool flatten_member_reference = (flags & ACCESS_CHAIN_FLATTEN_ALL_MEMBERS_BIT) != 0;

	if (!chain_only)
	{
		// We handle transpose explicitly, so don't resolve that here.
		auto *e = maybe_get<SPIRExpression>(base);
		bool old_transpose = e && e->need_transpose;
		if (e)
			e->need_transpose = false;
		expr = to_enclosed_expression(base, register_expression_read);
		if (e)
			e->need_transpose = old_transpose;
	}

	// Start traversing type hierarchy at the proper non-pointer types,
	// but keep type_id referencing the original pointer for use below.
	uint32_t type_id = expression_type_id(base);

	if (!backend.native_pointers)
	{
		if (ptr_chain)
			SPIRV_CROSS_THROW("Backend does not support native pointers and does not support OpPtrAccessChain.");

		// Wrapped buffer reference pointer types will need to poke into the internal "value" member before
		// continuing the access chain.
		if (should_dereference(base))
		{
			auto &type = get<SPIRType>(type_id);
			expr = dereference_expression(type, expr);
		}
	}

	const auto *type = &get_pointee_type(type_id);

	bool access_chain_is_arrayed = expr.find_first_of('[') != string::npos;
	bool row_major_matrix_needs_conversion = is_non_native_row_major_matrix(base);
	bool is_packed = has_extended_decoration(base, SPIRVCrossDecorationPhysicalTypePacked);
	uint32_t physical_type = get_extended_decoration(base, SPIRVCrossDecorationPhysicalTypeID);
	bool is_invariant = has_decoration(base, DecorationInvariant);
	bool relaxed_precision = has_decoration(base, DecorationRelaxedPrecision);
	bool pending_array_enclose = false;
	bool dimension_flatten = false;

	const auto append_index = [&](uint32_t index, bool is_literal, bool is_ptr_chain = false) {
		AccessChainFlags mod_flags = flags;
		if (!is_literal)
			mod_flags &= ~ACCESS_CHAIN_INDEX_IS_LITERAL_BIT;
		if (!is_ptr_chain)
			mod_flags &= ~ACCESS_CHAIN_PTR_CHAIN_BIT;
		access_chain_internal_append_index(expr, base, type, mod_flags, access_chain_is_arrayed, index);
		check_physical_type_cast(expr, type, physical_type);
	};

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		bool is_literal = index_is_literal;
		if (is_literal && msb_is_id && (index >> 31u) != 0u)
		{
			is_literal = false;
			index &= 0x7fffffffu;
		}

		// Pointer chains
		if (ptr_chain && i == 0)
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays)
			{
				dimension_flatten = type->array.size() >= 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(type->array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(*type, j - 1));
				}

				if (type->array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			else
			{
				append_index(index, is_literal, true);
			}

			if (type->basetype == SPIRType::ControlPointArray)
			{
				type_id = type->parent_type;
				type = &get<SPIRType>(type_id);
			}

			access_chain_is_arrayed = true;
		}
		// Arrays
		else if (!type->array.empty())
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays && !pending_array_enclose)
			{
				dimension_flatten = type->array.size() > 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			assert(type->parent_type);

			auto *var = maybe_get<SPIRVariable>(base);
			if (backend.force_gl_in_out_block && i == 0 && var && is_builtin_variable(*var) &&
			    !has_decoration(type->self, DecorationBlock))
			{
				// This deals with scenarios for tesc/geom where arrays of gl_Position[] are declared.
				// Normally, these variables live in blocks when compiled from GLSL,
				// but HLSL seems to just emit straight arrays here.
				// We must pretend this access goes through gl_in/gl_out arrays
				// to be able to access certain builtins as arrays.
				// Similar concerns apply for mesh shaders where we have to redirect to gl_MeshVerticesEXT or MeshPrimitivesEXT.
				auto builtin = ir.meta[base].decoration.builtin_type;
				bool mesh_shader = get_execution_model() == ExecutionModelMeshEXT;

				switch (builtin)
				{
				// case BuiltInCullDistance: // These are already arrays, need to figure out rules for these in tess/geom.
				// case BuiltInClipDistance:
				case BuiltInPosition:
				case BuiltInPointSize:
					if (mesh_shader)
						expr = join("gl_MeshVerticesEXT[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassInput)
						expr = join("gl_in[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassOutput)
						expr = join("gl_out[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				case BuiltInPrimitiveId:
				case BuiltInLayer:
				case BuiltInViewportIndex:
				case BuiltInCullPrimitiveEXT:
				case BuiltInPrimitiveShadingRateKHR:
					if (mesh_shader)
						expr = join("gl_MeshPrimitivesEXT[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				default:
					append_index(index, is_literal);
					break;
				}
			}
			else if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				auto &parent_type = get<SPIRType>(type->parent_type);

				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(parent_type.array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(parent_type, j - 1));
				}

				if (parent_type.array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			// Some builtins are arrays in SPIR-V but not in other languages, e.g. gl_SampleMask[] is an array in SPIR-V but not in Metal.
			// By throwing away the index, we imply the index was 0, which it must be for gl_SampleMask.
			else if (!builtin_translates_to_nonarray(BuiltIn(get_decoration(base, DecorationBuiltIn))))
			{
				append_index(index, is_literal);
			}

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);

			access_chain_is_arrayed = true;
		}
		// For structs, the index refers to a constant, which indexes into the members, possibly through a redirection mapping.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			if (!is_literal)
				index = evaluate_constant_u32(index);

			if (index < uint32_t(type->member_type_index_redirection.size()))
				index = type->member_type_index_redirection[index];

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			BuiltIn builtin;
			if (is_member_builtin(*type, index, &builtin) && access_chain_needs_stage_io_builtin_translation(base))
			{
				if (access_chain_is_arrayed)
				{
					expr += ".";
					expr += builtin_to_glsl(builtin, type->storage);
				}
				else
					expr = builtin_to_glsl(builtin, type->storage);
			}
			else
			{
				// If the member has a qualified name, use it as the entire chain
				string qual_mbr_name = get_member_qualified_name(type_id, index);
				if (!qual_mbr_name.empty())
					expr = qual_mbr_name;
				else if (flatten_member_reference)
					expr += join("_", to_member_name(*type, index));
				else
					expr += to_member_reference(base, *type, index, ptr_chain);
			}

			if (has_member_decoration(type->self, index, DecorationInvariant))
				is_invariant = true;
			if (has_member_decoration(type->self, index, DecorationRelaxedPrecision))
				relaxed_precision = true;

			is_packed = member_is_packed_physical_type(*type, index);
			if (member_is_remapped_physical_type(*type, index))
				physical_type = get_extended_member_decoration(type->self, index, SPIRVCrossDecorationPhysicalTypeID);
			else
				physical_type = 0;

			row_major_matrix_needs_conversion = member_is_non_native_row_major_matrix(*type, index);
			type = &get<SPIRType>(type->member_types[index]);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			// If we have a row-major matrix here, we need to defer any transpose in case this access chain
			// is used to store a column. We can resolve it right here and now if we access a scalar directly,
			// by flipping indexing order of the matrix.

			expr += "[";
			if (is_literal)
				expr += convert_to_string(index);
			else
				expr += to_unpacked_expression(index, register_expression_read);
			expr += "]";

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			string deferred_index;
			if (row_major_matrix_needs_conversion)
			{
				// Flip indexing order.
				auto column_index = expr.find_last_of('[');
				if (column_index != string::npos)
				{
					deferred_index = expr.substr(column_index);
					expr.resize(column_index);
				}
			}

			// Internally, access chain implementation can also be used on composites,
			// ignore scalar access workarounds in this case.
			StorageClass effective_storage = StorageClassGeneric;
			bool ignore_potential_sliced_writes = false;
			if ((flags & ACCESS_CHAIN_FORCE_COMPOSITE_BIT) == 0)
			{
				if (expression_type(base).pointer)
					effective_storage = get_expression_effective_storage_class(base);

				// Special consideration for control points.
				// Control points can only be written by InvocationID, so there is no need
				// to consider scalar access chains here.
				// Cleans up some cases where it's very painful to determine the accurate storage class
				// since blocks can be partially masked ...
				auto *var = maybe_get_backing_variable(base);
				if (var && var->storage == StorageClassOutput &&
				    get_execution_model() == ExecutionModelTessellationControl &&
				    !has_decoration(var->self, DecorationPatch))
				{
					ignore_potential_sliced_writes = true;
				}
			}
			else
				ignore_potential_sliced_writes = true;

			if (!row_major_matrix_needs_conversion && !ignore_potential_sliced_writes)
			{
				// On some backends, we might not be able to safely access individual scalars in a vector.
				// To work around this, we might have to cast the access chain reference to something which can,
				// like a pointer to scalar, which we can then index into.
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			if (is_literal)
			{
				bool out_of_bounds = (index >= type->vecsize);

				if (!is_packed && !row_major_matrix_needs_conversion)
				{
					expr += ".";
					expr += index_to_swizzle(out_of_bounds ? 0 : index);
				}
				else
				{
					// For packed vectors, we can only access them as an array, not by swizzle.
					expr += join("[", out_of_bounds ? 0 : index, "]");
				}
			}
			else if (ir.ids[index].get_type() == TypeConstant && !is_packed && !row_major_matrix_needs_conversion)
			{
				auto &c = get<SPIRConstant>(index);
				bool out_of_bounds = (c.scalar() >= type->vecsize);

				if (c.specialization)
				{
					// If the index is a spec constant, we cannot turn extract into a swizzle.
					expr += join("[", out_of_bounds ? "0" : to_expression(index), "]");
				}
				else
				{
					expr += ".";
					expr += index_to_swizzle(out_of_bounds ? 0 : c.scalar());
				}
			}
			else
			{
				expr += "[";
				expr += to_unpacked_expression(index, register_expression_read);
				expr += "]";
			}

			if (row_major_matrix_needs_conversion && !ignore_potential_sliced_writes)
			{
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			expr += deferred_index;
			row_major_matrix_needs_conversion = false;

			is_packed = false;
			physical_type = 0;
			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		else if (!backend.allow_truncated_access_chain)
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (pending_array_enclose)
	{
		SPIRV_CROSS_THROW("Flattening of multidimensional arrays were enabled, "
		                  "but the access chain was terminated in the middle of a multidimensional array. "
		                  "This is not supported.");
	}

	if (meta)
	{
		meta->need_transpose = row_major_matrix_needs_conversion;
		meta->storage_is_packed = is_packed;
		meta->storage_is_invariant = is_invariant;
		meta->storage_physical_type = physical_type;
		meta->relaxed_precision = relaxed_precision;
	}

	return expr;
}